

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environmental_Process_PDU.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::PDU::Environmental_Process_PDU::operator==
          (Environmental_Process_PDU *this,Environmental_Process_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if ((((!KVar1) &&
       (KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EnvProcID,&Value->m_EnvProcID),
       !KVar1)) &&
      (KVar1 = DATA_TYPE::EnvironmentType::operator!=(&this->m_EnvType,&Value->m_EnvType), !KVar1))
     && (((this->m_ui8ModelType == Value->m_ui8ModelType &&
          ((this->field_3).m_ui8EnvStatus == (Value->field_3).m_ui8EnvStatus)) &&
         ((this->m_ui16NumEnvRec == Value->m_ui16NumEnvRec &&
          (this->m_ui16SeqNum == Value->m_ui16SeqNum)))))) {
    bVar2 = std::operator!=(&this->m_vEnvRecords,&Value->m_vEnvRecords);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL Environmental_Process_PDU::operator == ( const Environmental_Process_PDU & Value ) const
{
    if( Header::operator != ( Value ) )             return false;
    if( m_EnvProcID      != Value.m_EnvProcID )     return false;
    if( m_EnvType        != Value.m_EnvType )       return false;
    if( m_ui8ModelType   != Value.m_ui8ModelType )  return false;
    if( m_ui8EnvStatus   != Value.m_ui8EnvStatus )  return false;
    if( m_ui16NumEnvRec  != Value.m_ui16NumEnvRec ) return false;
    if( m_ui16SeqNum     != Value.m_ui16SeqNum )    return false;
    if( m_vEnvRecords    != Value.m_vEnvRecords )   return false;
    return true;
}